

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void sarima_summary(sarima_object obj)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  
  iVar7 = obj->q;
  iVar2 = obj->p;
  iVar3 = obj->P;
  iVar4 = obj->Q;
  iVar5 = obj->M;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    iVar8 = obj->retval;
    if (iVar8 == 0) {
      pcVar6 = "Input Error";
    }
    else if (iVar8 == 0xf) {
      pcVar6 = "Optimization Routine Encountered Inf/Nan Values";
    }
    else if (iVar8 == 4) {
      pcVar6 = "Optimization Routine didn\'t converge";
    }
    else {
      if (iVar8 != 1) goto LAB_0010e46c;
      pcVar6 = "Probable Success";
    }
    printf(pcVar6);
  }
LAB_0010e46c:
  puts("\n");
  iVar8 = 0;
  printf("ARIMA Seasonal Order : (%d, %d, %d) * (%d, %d, %d)[%d]\n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,
         (ulong)(uint)obj->Q,(ulong)(uint)obj->s);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  iVar7 = iVar7 + iVar2 + iVar3 + iVar4 + iVar5 + 1;
  for (lVar9 = 0; lVar9 < obj->p; lVar9 = lVar9 + 1) {
    dVar1 = obj->phi[lVar9];
    if (obj->vcov[iVar8] < 0.0) {
      sqrt(obj->vcov[iVar8]);
    }
    printf("AR%-15d%-20g%-20g \n",dVar1,(ulong)((int)lVar9 + 1));
    iVar8 = iVar8 + iVar7;
  }
  for (lVar9 = 0; lVar9 < obj->q; lVar9 = lVar9 + 1) {
    dVar1 = obj->theta[lVar9];
    if (obj->vcov[(obj->p + (int)lVar9) * iVar7] < 0.0) {
      sqrt(obj->vcov[(obj->p + (int)lVar9) * iVar7]);
    }
    printf("MA%-15d%-20g%-20g \n",dVar1,(ulong)((int)lVar9 + 1));
  }
  for (lVar9 = 0; lVar9 < obj->P; lVar9 = lVar9 + 1) {
    dVar1 = obj->PHI[lVar9];
    if (obj->vcov[(obj->p + obj->q + (int)lVar9) * iVar7] < 0.0) {
      sqrt(obj->vcov[(obj->p + obj->q + (int)lVar9) * iVar7]);
    }
    printf("SAR%-14d%-20g%-20g \n",dVar1,(ulong)((int)lVar9 + 1));
  }
  for (lVar9 = 0; lVar9 < obj->Q; lVar9 = lVar9 + 1) {
    dVar1 = obj->THETA[lVar9];
    if (obj->vcov[(obj->p + obj->q + obj->P + (int)lVar9) * iVar7] < 0.0) {
      sqrt(obj->vcov[(obj->p + obj->q + obj->P + (int)lVar9) * iVar7]);
    }
    printf("SMA%-14d%-20g%-20g \n",dVar1,(ulong)((int)lVar9 + 1));
  }
  putchar(10);
  if (obj->M == 1) {
    dVar1 = obj->mean;
    dVar10 = obj->vcov[(obj->q + obj->p + obj->P + obj->Q) * iVar7];
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    printf("%-17s%-20g%-20g \n",dVar1,dVar10,"MEAN");
  }
  else {
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_00158cf8 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->method == 2) {
    pcVar6 = "Newton-Raphson";
  }
  else {
    if (7 < (ulong)(uint)obj->optmethod) goto LAB_0010e7ba;
    pcVar6 = (&PTR_anon_var_dwarf_caa_00158da8)[(uint)obj->optmethod];
  }
  printf(pcVar6);
LAB_0010e7ba:
  puts("\n");
  if ((uint)obj->method < 2) {
    printf("Log Likelihood : %g ",obj->loglik);
  }
  else {
    printf("Log Likelihood : Unavailable ");
  }
  puts("\n");
  if (obj->method == 0) {
    printf("AIC criterion : %g ",obj->aic);
  }
  else {
    printf("AIC Criterion : Unavailable ");
  }
  puts("\n");
  return;
}

Assistant:

void sarima_summary(sarima_object obj) {
	int i,pq,t;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : (%d, %d, %d) * (%d, %d, %d)[%d]\n",
		obj->p, obj->d, obj->q, obj->P, obj->D ,obj->Q, obj->s);
	printf("\n");

	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (obj->M == 1) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("MLE");
	}
	else if (obj->method == 1) {
		printf("CSS");
	}
	else if (obj->method == 2) {
		printf("BOX-JENKINS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	if (obj->method == 2) {
		printf("Newton-Raphson");
	}
	else {
		if (obj->optmethod == 0) {
			printf("Nelder-Mead");
		}
		else if (obj->optmethod == 1) {
			printf("Newton Line Search");
		}
		else if (obj->optmethod == 2) {
			printf("Newton Trust Region - Hook Step");
		}
		else if (obj->optmethod == 3) {
			printf("Newton Trust Region - Double Dog-Leg");
		}
		else if (obj->optmethod == 4) {
			printf("Conjugate Gradient");
		}
		else if (obj->optmethod == 5) {
			printf("BFGS");
		}
		else if (obj->optmethod == 6) {
			printf("L-BFGS");
		}
		else if (obj->optmethod == 7) {
			printf("BFGS More-Thuente Line Search");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	else {
		printf("Log Likelihood : Unavailable ");
		printf("\n\n");
	}
	if (obj->method == 0) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
	/*
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	*/
}